

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<duckdb::date_t,double,duckdb::ArgMinMaxState<duckdb::date_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::date_t,_double> *state,date_t *x,double *y,
               AggregateBinaryInput *binary)

{
  int32_t iVar1;
  bool bVar2;
  double local_18;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
    (state->arg).days = x->days;
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  else {
    iVar1 = x->days;
    local_18 = *y;
    bVar2 = GreaterThan::Operation<double>(&state->value,&local_18);
    if (bVar2) {
      (state->arg).days = iVar1;
      state->value = local_18;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}